

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool pmsav7_use_background_region(ARMCPU_conflict1 *cpu,ARMMMUIdx mmu_idx,_Bool is_user)

{
  _Bool _Var1;
  uint32_t uVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  
  if ((int)CONCAT71(in_register_00000011,is_user) == 0) {
    if (((cpu->env).features & 0x200) == 0) {
      uVar2 = regime_el(&cpu->env,mmu_idx);
      _Var1 = (_Bool)((*(byte *)((long)(cpu->env).cp15.cptr_el + (ulong)uVar2 * 8 + -0x26) & 2) >> 1
                     );
    }
    else {
      uVar3 = mmu_idx - ARMMMUIdx_E10_0;
      if ((0x37 < uVar3) || ((0xff000000070fffU >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                   ,0x37c,(char *)0x0);
      }
      _Var1 = (_Bool)(((byte)(cpu->env).v7m.mpu_ctrl[*(long *)(&DAT_00d7d578 + (ulong)uVar3 * 8)] &
                      4) >> 2);
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool pmsav7_use_background_region(ARMCPU *cpu,
                                         ARMMMUIdx mmu_idx, bool is_user)
{
    /* Return true if we should use the default memory map as a
     * "background" region if there are no hits against any MPU regions.
     */
    CPUARMState *env = &cpu->env;

    if (is_user) {
        return false;
    }

    if (arm_feature(env, ARM_FEATURE_M)) {
        return env->v7m.mpu_ctrl[regime_is_secure(env, mmu_idx)]
            & R_V7M_MPU_CTRL_PRIVDEFENA_MASK;
    } else {
        return regime_sctlr(env, mmu_idx) & SCTLR_BR;
    }
}